

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseGTMCoverage.cxx
# Opt level: O0

bool __thiscall
cmParseGTMCoverage::FindFunctionInMumpsFile
          (cmParseGTMCoverage *this,string *filepath,string *function,int *lineoffset)

{
  char cVar1;
  cmCTest *this_00;
  byte bVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  ostream *poVar6;
  string local_418 [32];
  undefined1 local_3f8 [8];
  ostringstream cmCTestLog_msg;
  char nextchar_1;
  char prevchar;
  char nextchar;
  size_type pos;
  undefined1 local_268 [4];
  int linenum;
  string line;
  long local_238;
  ifstream in;
  int *lineoffset_local;
  string *function_local;
  string *filepath_local;
  cmParseGTMCoverage *this_local;
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_238,pcVar4,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&local_238 + *(long *)(local_238 + -0x18)));
  if ((bVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)local_268);
    pos._4_4_ = 0;
    while (bVar3 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&local_238,(string *)local_268,(bool *)0x0,
                              0xffffffffffffffff), bVar3) {
      lVar5 = std::__cxx11::string::find((string *)local_268,(ulong)function);
      if (lVar5 == 0) {
        std::__cxx11::string::size();
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_268);
        cVar1 = *pcVar4;
        if (((cVar1 == ' ') || (cVar1 == '(')) || (cVar1 == '\t')) {
          *lineoffset = pos._4_4_;
          this_local._7_1_ = true;
          goto LAB_009ae954;
        }
      }
      if (lVar5 == 1) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_268);
        cVar1 = *pcVar4;
        std::__cxx11::string::size();
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_268);
        if ((cVar1 == '%') && ((*pcVar4 == ' ' || (*pcVar4 == '(')))) {
          *lineoffset = pos._4_4_;
          this_local._7_1_ = true;
          goto LAB_009ae954;
        }
      }
      pos._4_4_ = pos._4_4_ + 1;
    }
    *lineoffset = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
    poVar6 = std::operator<<((ostream *)local_3f8,"Could not find entry point : ");
    poVar6 = std::operator<<(poVar6,(string *)function);
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = std::operator<<(poVar6,(string *)filepath);
    std::operator<<(poVar6,"\n");
    this_00 = (this->super_cmParseMumpsCoverage).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseGTMCoverage.cxx"
                 ,0x9c,pcVar4,false);
    std::__cxx11::string::~string(local_418);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f8);
    this_local._7_1_ = false;
LAB_009ae954:
    line.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_268);
  }
  else {
    this_local._7_1_ = false;
    line.field_2._8_4_ = 1;
  }
  std::ifstream::~ifstream(&local_238);
  return this_local._7_1_;
}

Assistant:

bool cmParseGTMCoverage::FindFunctionInMumpsFile(std::string const& filepath,
                                                 std::string const& function,
                                                 int& lineoffset)
{
  cmsys::ifstream in(filepath.c_str());
  if (!in) {
    return false;
  }
  std::string line;
  int linenum = 0;
  while (cmSystemTools::GetLineFromStream(in, line)) {
    std::string::size_type pos = line.find(function);
    if (pos == 0) {
      char nextchar = line[function.size()];
      if (nextchar == ' ' || nextchar == '(' || nextchar == '\t') {
        lineoffset = linenum;
        return true;
      }
    }
    if (pos == 1) {
      char prevchar = line[0];
      char nextchar = line[function.size() + 1];
      if (prevchar == '%' && (nextchar == ' ' || nextchar == '(')) {
        lineoffset = linenum;
        return true;
      }
    }
    linenum++; // move to next line count
  }
  lineoffset = 0;
  cmCTestLog(this->CTest, ERROR_MESSAGE,
             "Could not find entry point : " << function << " in " << filepath
                                             << "\n");
  return false;
}